

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_get_new_frame_image(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined4 *puVar2;
  int iVar3;
  aom_codec_err_t aVar4;
  undefined8 *puVar5;
  undefined4 uVar6;
  YV12_BUFFER_CONFIG new_frame;
  anon_union_8_2_2fc10223_for_yv12_buffer_config_0 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  int local_b8;
  int local_b4;
  long local_b0;
  long local_a8;
  long local_a0;
  undefined8 local_68;
  undefined8 local_50;
  int local_48;
  int local_44;
  undefined4 local_40;
  undefined8 local_3c;
  undefined4 local_34;
  byte local_30;
  undefined8 local_2c;
  undefined8 local_24;
  byte local_18;
  
  uVar1 = args->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar5 = (undefined8 *)((ulong)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    puVar5 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = puVar5 + 1;
  }
  puVar2 = (undefined4 *)*puVar5;
  if (puVar2 == (undefined4 *)0x0) {
    aVar4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar3 = av1_get_last_show_frame(ctx->ppi->cpi,(YV12_BUFFER_CONFIG *)&local_d8.field_0);
    aVar4 = AOM_CODEC_ERROR;
    if (iVar3 == 0) {
      if (local_44 == 0) {
        if (local_48 == 0) {
          *puVar2 = 0x106;
          iVar3 = 0x18;
          local_48 = 0;
          uVar6 = 0x906;
        }
        else {
          *puVar2 = 0x105;
          iVar3 = 0x10;
          uVar6 = 0x905;
        }
      }
      else {
        *puVar2 = 0x102;
        iVar3 = 0xc;
        uVar6 = 0x902;
      }
      *(undefined8 *)(puVar2 + 1) = local_3c;
      puVar2[3] = local_34;
      puVar2[4] = (uint)local_30;
      *(undefined8 *)(puVar2 + 5) = local_2c;
      puVar2[9] = 8;
      puVar2[7] = local_d8.field_0.y_width;
      puVar2[8] = local_d0;
      puVar2[10] = local_c8;
      puVar2[0xb] = local_c0;
      *(undefined8 *)(puVar2 + 0xc) = local_24;
      puVar2[0xe] = local_48;
      puVar2[0xf] = local_44;
      *(long *)(puVar2 + 0x10) = local_b0;
      *(long *)(puVar2 + 0x12) = local_a8;
      *(long *)(puVar2 + 0x14) = local_a0;
      puVar2[0x16] = local_b8;
      puVar2[0x17] = local_b4;
      puVar2[0x18] = local_b4;
      if ((local_18 & 8) != 0) {
        iVar3 = iVar3 * 2;
        *puVar2 = uVar6;
        puVar2[9] = local_40;
        *(long *)(puVar2 + 0x10) = local_b0 * 2;
        *(long *)(puVar2 + 0x12) = local_a8 * 2;
        *(long *)(puVar2 + 0x14) = local_a0 * 2;
        puVar2[0x16] = local_b8 * 2;
        puVar2[0x17] = local_b4 * 2;
        puVar2[0x18] = local_b4 * 2;
      }
      puVar2[0x1c] = iVar3;
      aVar4 = AOM_CODEC_OK;
      *(undefined8 *)(puVar2 + 0x20) = 0;
      *(undefined8 *)(puVar2 + 0x22) = local_68;
      *(undefined8 *)(puVar2 + 0x24) = 0;
      *(undefined8 *)(puVar2 + 0x1a) = local_50;
      *(undefined8 *)(puVar2 + 0x26) = 0;
    }
  }
  return aVar4;
}

Assistant:

static aom_codec_err_t ctrl_get_new_frame_image(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  aom_image_t *new_img = va_arg(args, aom_image_t *);
  if (new_img) {
    YV12_BUFFER_CONFIG new_frame;
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;

    if (av1_get_frame_to_show(frame_worker_data->pbi, &new_frame) == 0) {
      yuvconfig2image(new_img, &new_frame, NULL);
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}